

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_common.c
# Opt level: O0

apx_typeCode_t apx_vm_variant_to_type_code(uint8_t variant)

{
  apx_typeCode_t local_a;
  apx_typeCode_t retval;
  uint8_t variant_local;
  
  switch(variant) {
  case '\0':
    local_a = '\x01';
    break;
  case '\x01':
    local_a = '\x02';
    break;
  case '\x02':
    local_a = '\x03';
    break;
  case '\x03':
    local_a = '\x04';
    break;
  case '\x04':
    local_a = '\x05';
    break;
  case '\x05':
    local_a = '\x06';
    break;
  case '\x06':
    local_a = '\a';
    break;
  case '\a':
    local_a = '\b';
    break;
  case '\b':
    local_a = '\r';
    break;
  case '\t':
    local_a = '\x0e';
    break;
  case '\n':
    local_a = '\x0f';
    break;
  default:
    local_a = '\0';
    break;
  case '\f':
    local_a = '\t';
    break;
  case '\r':
    local_a = '\n';
    break;
  case '\x0e':
    local_a = '\v';
    break;
  case '\x0f':
    local_a = '\f';
  }
  return local_a;
}

Assistant:

apx_typeCode_t apx_vm_variant_to_type_code(uint8_t variant)
{
   apx_typeCode_t retval;
   switch (variant)
   {
   case APX_VM_VARIANT_UINT8:
      retval = APX_TYPE_CODE_UINT8;
      break;
   case APX_VM_VARIANT_UINT16:
      retval = APX_TYPE_CODE_UINT16;
      break;
   case APX_VM_VARIANT_UINT32:
      retval = APX_TYPE_CODE_UINT32;
      break;
   case APX_VM_VARIANT_UINT64:
      retval = APX_TYPE_CODE_UINT64;
      break;
   case APX_VM_VARIANT_INT8:
      retval = APX_TYPE_CODE_INT8;
      break;
   case APX_VM_VARIANT_INT16:
      retval = APX_TYPE_CODE_INT16;
      break;
   case APX_VM_VARIANT_INT32:
      retval = APX_TYPE_CODE_INT32;
      break;
   case APX_VM_VARIANT_INT64:
      retval = APX_TYPE_CODE_INT64;
      break;
   case APX_VM_VARIANT_BOOL:
      retval = APX_TYPE_CODE_BOOL;
      break;
   case APX_VM_VARIANT_BYTE:
      retval = APX_TYPE_CODE_BYTE;
      break;
   case APX_VM_VARIANT_RECORD:
      retval = APX_TYPE_CODE_RECORD;
      break;
   case APX_VM_VARIANT_CHAR:
      retval = APX_TYPE_CODE_CHAR;
      break;
   case APX_VM_VARIANT_CHAR8:
      retval = APX_TYPE_CODE_CHAR8;
      break;
   case APX_VM_VARIANT_CHAR16:
      retval = APX_TYPE_CODE_CHAR16;
      break;
   case APX_VM_VARIANT_CHAR32:
      retval = APX_TYPE_CODE_CHAR32;
      break;
   default:
      retval = APX_TYPE_CODE_NONE;
   }
   return retval;
}